

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::setIsMemberOfGroup(QGraphicsItemPrivate *this,bool enabled)

{
  byte bVar1;
  bool bVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemGroup *pQVar4;
  const_iterator o;
  byte in_SIL;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *child;
  add_const_t<QList<QGraphicsItem_*>_> *__range2;
  QGraphicsItem *q;
  const_iterator __end2;
  const_iterator __begin2;
  undefined7 in_stack_ffffffffffffffd0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  pQVar3 = q_func(in_RDI);
  *(ulong *)&in_RDI->field_0x160 =
       *(ulong *)&in_RDI->field_0x160 & 0xffffffffffffefff | (ulong)(bVar1 & 1) << 0xc;
  pQVar4 = qgraphicsitem_cast<QGraphicsItemGroup*>((QGraphicsItem *)in_RDI);
  if (pQVar4 == (QGraphicsItemGroup *)0x0) {
    local_10.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
    o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
    while (bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_10,o), bVar2) {
      QList<QGraphicsItem_*>::const_iterator::operator*(&local_10);
      QGraphicsItem::d_func((QGraphicsItem *)0x971932);
      setIsMemberOfGroup((QGraphicsItemPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                         SUB81((ulong)pQVar3 >> 0x38,0));
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setIsMemberOfGroup(bool enabled)
{
    Q_Q(QGraphicsItem);
    isMemberOfGroup = enabled;
    if (!qgraphicsitem_cast<QGraphicsItemGroup *>(q)) {
        for (QGraphicsItem *child : std::as_const(children))
            child->d_func()->setIsMemberOfGroup(enabled);
    }
}